

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O2

Twist * __thiscall
iDynTree::SpatialInertia::applyInverse
          (Twist *__return_storage_ptr__,SpatialInertia *this,SpatialMomentum *mom)

{
  undefined1 local_358 [16];
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_348 [2];
  Matrix<double,_6,_1,_0,_6,_1> velEigen;
  Matrix<double,_6,_1,_0,_6,_1> momEigen;
  Vector6 ret;
  Matrix6x6 I;
  
  Twist::Twist(__return_storage_ptr__);
  ret.m_data[0] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
       super_Vector3.m_data[0];
  ret.m_data[1] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
       super_Vector3.m_data[1];
  ret.m_data[2] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
       super_Vector3.m_data[2];
  ret.m_data[3] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3
       .super_Vector3.m_data[0];
  ret.m_data[4] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3
       .super_Vector3.m_data[1];
  ret.m_data[5] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3
       .super_Vector3.m_data[2];
  I.m_data[0] = (double)&ret;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  _set_noalias<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&momEigen,
             (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&I);
  asMatrix(&I,this);
  local_348[0] = (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&I;
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>::
  householderQr((HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&ret,
                (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                 *)local_348);
  local_358._0_8_ = (HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&ret;
  local_358._8_8_ = (PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&momEigen;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  _set_noalias<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&velEigen,
             (DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_358);
  ret.m_data[3] = 0.0;
  ret.m_data[5] = 2.96439387504748e-323;
  local_358._0_8_ = __return_storage_ptr__;
  ret.m_data[0] = (double)&velEigen;
  ret.m_data[2] = (double)&velEigen;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_358,
             (Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)&ret);
  ret.m_data[0] =
       (double)(velEigen.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array + 3);
  ret.m_data[3] = 1.48219693752374e-323;
  ret.m_data[5] = 2.96439387504748e-323;
  local_358._0_8_ =
       &(__return_storage_ptr__->super_SpatialMotionVector).
        super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3;
  ret.m_data[2] = (double)&velEigen;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_358,
             (Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)&ret);
  return __return_storage_ptr__;
}

Assistant:

Twist SpatialInertia::applyInverse(const SpatialMomentum& mom) const
{
    Twist vel;

    Eigen::Matrix<double,6,1> momEigen = toEigen(mom.asVector());

    Matrix6x6 I = this->asMatrix();
    Eigen::Matrix<double,6,1> velEigen = toEigen(I).householderQr().solve(momEigen);

    toEigen(vel.getLinearVec3()) = velEigen.block<3,1>(0,0);
    toEigen(vel.getAngularVec3()) = velEigen.block<3,1>(3,0);

    return vel;
}